

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_copy(roaring64_bitmap_t *r)

{
  uint8_t uVar1;
  roaring64_bitmap_t *prVar2;
  leaf_t result_leaf;
  container_t *result_container;
  uint8_t result_typecode;
  leaf_t leaf;
  art_iterator_t it;
  roaring64_bitmap_t *result;
  leaf_t in_stack_ffffffffffffff38;
  roaring64_bitmap_t *in_stack_ffffffffffffff40;
  uint8_t typecode;
  art_t *in_stack_ffffffffffffff48;
  undefined1 copy_on_write;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  container_t *c;
  undefined8 local_98;
  
  prVar2 = roaring64_bitmap_create();
  art_init_iterator((art_t *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                    SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  while (copy_on_write = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38),
        local_98 != (leaf_t *)0x0) {
    c = (container_t *)*local_98;
    uVar1 = get_typecode((leaf_t)c);
    get_container(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    typecode = (uint8_t)((ulong)in_stack_ffffffffffffff40 >> 0x38);
    in_stack_ffffffffffffff48 =
         (art_t *)get_copy_of_container
                            (c,(uint8_t *)CONCAT17(uVar1,in_stack_ffffffffffffff50),
                             (_Bool)copy_on_write);
    in_stack_ffffffffffffff40 =
         (roaring64_bitmap_t *)
         add_container((roaring64_bitmap_t *)CONCAT17(uVar1,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,typecode);
    art_insert(in_stack_ffffffffffffff48,(art_key_chunk_t *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    art_iterator_next((art_iterator_t *)0x1048fd);
  }
  return prVar2;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_copy(const roaring64_bitmap_t *r) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t leaf = (leaf_t)*it.value;
        uint8_t result_typecode = get_typecode(leaf);
        container_t *result_container = get_copy_of_container(
            get_container(r, leaf), &result_typecode, /*copy_on_write=*/false);
        leaf_t result_leaf =
            add_container(result, result_container, result_typecode);
        art_insert(&result->art, it.key, (art_val_t)result_leaf);
        art_iterator_next(&it);
    }
    return result;
}